

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

HTS_Boolean HTS_get_pattern_token(HTS_File *fp,char *buff)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *in_RSI;
  long lVar4;
  long in_RDI;
  HTS_Boolean dquote;
  HTS_Boolean squote;
  size_t i;
  char c;
  HTS_File *in_stack_ffffffffffffffc8;
  long local_28;
  char local_19;
  HTS_Boolean local_1;
  
  bVar1 = false;
  bVar2 = false;
  if ((in_RDI == 0) || (iVar3 = HTS_feof(in_stack_ffffffffffffffc8), iVar3 != 0)) {
    local_1 = '\0';
  }
  else {
    iVar3 = HTS_fgetc(in_stack_ffffffffffffffc8);
    local_19 = (char)iVar3;
    while (local_19 == ' ' || local_19 == '\n') {
      iVar3 = HTS_feof(in_stack_ffffffffffffffc8);
      if (iVar3 != 0) {
        return '\0';
      }
      iVar3 = HTS_fgetc(in_stack_ffffffffffffffc8);
      local_19 = (char)iVar3;
    }
    if (local_19 == '\'') {
      iVar3 = HTS_feof(in_stack_ffffffffffffffc8);
      if (iVar3 != 0) {
        return '\0';
      }
      iVar3 = HTS_fgetc(in_stack_ffffffffffffffc8);
      local_19 = (char)iVar3;
      bVar1 = true;
    }
    if (local_19 == '\"') {
      iVar3 = HTS_feof(in_stack_ffffffffffffffc8);
      if (iVar3 != 0) {
        return '\0';
      }
      iVar3 = HTS_fgetc(in_stack_ffffffffffffffc8);
      local_19 = (char)iVar3;
      bVar2 = true;
    }
    if (local_19 == ',') {
      strcpy(in_RSI,",");
      local_1 = '\x01';
    }
    else {
      local_28 = 0;
      do {
        lVar4 = local_28 + 1;
        in_RSI[local_28] = local_19;
        iVar3 = HTS_fgetc(in_stack_ffffffffffffffc8);
        local_19 = (char)iVar3;
        if (((bVar1) && (local_19 == '\'')) || ((bVar2 && (local_19 == '\"')))) break;
        local_28 = lVar4;
      } while (((bVar1) || (bVar2)) ||
              ((local_19 != ' ' &&
               ((local_19 != '\n' && (iVar3 = HTS_feof(in_stack_ffffffffffffffc8), iVar3 == 0))))));
      in_RSI[lVar4] = '\0';
      local_1 = '\x01';
    }
  }
  return local_1;
}

Assistant:

HTS_Boolean HTS_get_pattern_token(HTS_File * fp, char *buff)
{
   char c;
   size_t i;
   HTS_Boolean squote = FALSE, dquote = FALSE;

   if (fp == NULL || HTS_feof(fp))
      return FALSE;
   c = HTS_fgetc(fp);

   while (c == ' ' || c == '\n') {
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
   }

   if (c == '\'') {             /* single quote case */
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
      squote = TRUE;
   }

   if (c == '\"') {             /*double quote case */
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
      dquote = TRUE;
   }

   if (c == ',') {              /*special character ',' */
      strcpy(buff, ",");
      return TRUE;
   }

   i = 0;
   while (1) {
      buff[i++] = c;
      c = HTS_fgetc(fp);
      if (squote && c == '\'')
         break;
      if (dquote && c == '\"')
         break;
      if (!squote && !dquote) {
         if (c == ' ')
            break;
         if (c == '\n')
            break;
         if (HTS_feof(fp))
            break;
      }
   }

   buff[i] = '\0';
   return TRUE;
}